

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O2

void __thiscall
Memory::LargeHeapBlock::SetTrackerData(LargeHeapBlock *this,void *address,void *data)

{
  uint uVar1;
  undefined4 *puVar2;
  code *pcVar3;
  bool bVar4;
  LargeObjectHeader *pLVar5;
  void **ppvVar6;
  undefined8 *in_FS_OFFSET;
  
  bVar4 = Recycler::DoProfileAllocTracker();
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x934,"(Recycler::DoProfileAllocTracker())",
                       "Recycler::DoProfileAllocTracker()");
    if (!bVar4) goto LAB_0026a249;
    *puVar2 = 0;
  }
  pLVar5 = GetHeader(this,address);
  if (pLVar5 < (LargeObjectHeader *)(this->super_HeapBlock).address) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x936,"((char *)header >= this->address)","(char *)header >= this->address")
    ;
    if (!bVar4) goto LAB_0026a249;
    *puVar2 = 0;
  }
  uVar1 = pLVar5->objectIndex;
  if (this->allocCount <= uVar1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x938,"(index < this->allocCount)","index < this->allocCount");
    if (!bVar4) goto LAB_0026a249;
    *puVar2 = 0;
  }
  if ((LargeObjectHeader *)(&this[1].super_HeapBlock._vptr_HeapBlock)[uVar1] != pLVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x939,"(this->HeaderList()[index] == header)",
                       "this->HeaderList()[index] == header");
    if (!bVar4) {
LAB_0026a249:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar2 = 0;
  }
  ppvVar6 = GetTrackerDataArray(this);
  ppvVar6[uVar1] = data;
  return;
}

Assistant:

void
LargeHeapBlock::SetTrackerData(void * address, void * data)
{
    Assert(Recycler::DoProfileAllocTracker());
    LargeObjectHeader * header = GetHeader(address);
    Assert((char *)header >= this->address);
    uint index = header->objectIndex;
    Assert(index < this->allocCount);
    Assert(this->HeaderList()[index] == header);
    this->GetTrackerDataArray()[index] = data;
}